

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::numeric> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::numeric>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::numeric&>(allocator_type<cs_impl::any::holder<cs::numeric>,64ul,cs_impl::default_allocator_provider>
                    *this,numeric *args)

{
  long lVar1;
  undefined8 uVar2;
  holder<cs::numeric> *phVar3;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    phVar3 = (holder<cs::numeric> *)operator_new(0x30);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    phVar3 = *(holder<cs::numeric> **)(this + lVar1 * 8 + -8);
  }
  (phVar3->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__baseHolder_0023ed20;
  uVar2 = *(undefined8 *)((long)&args->data + 8);
  (phVar3->mDat).data._int = (args->data)._int;
  *(undefined8 *)((long)&(phVar3->mDat).data + 8) = uVar2;
  (phVar3->mDat).type = args->type;
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}